

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool ReadMeshDoublePrecisionVertices(ON_BinaryArchive *file,ON_SimpleArray<ON_3dPoint> *dV)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  bool local_41;
  ON_3dPoint *pOStack_40;
  bool bFailedCRC;
  ON_3dPoint *a;
  size_t sz;
  uint dVcount;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_SimpleArray<ON_3dPoint> *dV_local;
  ON_BinaryArchive *file_local;
  
  _minor_version = dV;
  dV_local = (ON_SimpleArray<ON_3dPoint> *)file;
  ON_SimpleArray<ON_3dPoint>::SetCount(dV,0);
  iStack_24 = 0;
  dVcount = 0;
  bVar2 = ON_BinaryArchive::BeginRead3dmChunk
                    ((ON_BinaryArchive *)dV_local,0x40008000,&stack0xffffffffffffffdc,
                     (int *)&dVcount);
  if (bVar2) {
    sz._7_1_ = 0;
    if (iStack_24 == 1) {
      sz._0_4_ = 0;
      bVar2 = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)dV_local,(ON__UINT32 *)&sz);
      if (bVar2) {
        if ((uint)sz == 0) {
          sz._7_1_ = 1;
        }
        else {
          a = (ON_3dPoint *)0x0;
          bVar2 = ON_BinaryArchive::ReadCompressedBufferSize
                            ((ON_BinaryArchive *)dV_local,(size_t *)&a);
          if (bVar2) {
            if (a == (ON_3dPoint *)((ulong)(uint)sz * 0x18)) {
              ON_SimpleArray<ON_3dPoint>::SetCapacity(_minor_version,(ulong)(uint)sz);
              ON_SimpleArray<ON_3dPoint>::SetCount(_minor_version,(uint)sz);
              pOStack_40 = ON_SimpleArray<ON_3dPoint>::Array(_minor_version);
              uVar1 = (uint)sz;
              if ((pOStack_40 == (ON_3dPoint *)0x0) ||
                 (uVar3 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(_minor_version), uVar1 != uVar3)
                 ) {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                           ,0x85f,"","Unable to allocate double precision vertex point array.");
              }
              else {
                local_41 = false;
                bVar2 = ON_BinaryArchive::ReadCompressedBuffer
                                  ((ON_BinaryArchive *)dV_local,(size_t)a,pOStack_40,&local_41);
                if (bVar2) {
                  sz._7_1_ = 1;
                }
              }
            }
            else {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                         ,0x856,"","Compressed double precision vertex point buffer size is wrong.")
              ;
            }
          }
        }
      }
    }
    if ((sz._7_1_ & 1) == 0) {
      ON_SimpleArray<ON_3dPoint>::SetCount(_minor_version,0);
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk((ON_BinaryArchive *)dV_local);
    if (!bVar2) {
      sz._7_1_ = 0;
    }
    file_local._7_1_ = (bool)(sz._7_1_ & 1);
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

static
bool ReadMeshDoublePrecisionVertices( 
  ON_BinaryArchive& file, 
  ON_SimpleArray<ON_3dPoint>& dV 
  )
{
  dV.SetCount(0);

  int major_version = 0;
  int minor_version = 0;
  if ( !file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version) )
    return false;

  bool rc = false;
  for(;;)
  {
    if (1 != major_version)
      break;

    unsigned int dVcount = 0;
    if (!file.ReadInt(&dVcount))
      break;

    if (0 == dVcount)
    {
      rc = true;
      break;
    }

    size_t sz = 0;
    if (!file.ReadCompressedBufferSize( &sz ))
      break;

    if (sz != ((size_t)dVcount)*sizeof(ON_3dPoint))
    {
      ON_ERROR("Compressed double precision vertex point buffer size is wrong.");
      break;
    }

    dV.SetCapacity(dVcount);
    dV.SetCount(dVcount);
    ON_3dPoint* a = dV.Array();
    if (nullptr == a || dVcount != dV.UnsignedCount())
    {
      ON_ERROR("Unable to allocate double precision vertex point array.");
      break;
    }
    
    bool bFailedCRC = 0;
    if (!file.ReadCompressedBuffer( sz, a, &bFailedCRC))
      break;

    rc = true;
    break;
  }

  if (!rc)
    dV.SetCount(0);
  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}